

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_spy_Hook_amd64_gcc.cpp
# Opt level: O0

void __thiscall axl::spy::HookArena::~HookArena(HookArena *this)

{
  void *pvVar1;
  ExecutableBlockArena<axl::spy::Hook> *in_RDI;
  
  mem::ExecutableBlockArena<axl::spy::Hook>::detach(in_RDI);
  pvVar1 = (void *)in_RDI->m_allocSize;
  if (pvVar1 != (void *)0x0) {
    mem::ExecutableBlockArena<axl::spy::Hook>::~ExecutableBlockArena(in_RDI);
    operator_delete(pvVar1);
  }
  return;
}

Assistant:

HookArena::~HookArena() {
	((mem::ExecutableBlockArena<Hook>*)m_impl)->detach(); // don't free unless explicitly requested
	delete (mem::ExecutableBlockArena<Hook>*)m_impl;
}